

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O3

Vec_Int_t * Llb_DriverCountRefs(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  int iVar8;
  uint uVar9;
  
  iVar1 = p->vObjs->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar7->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
      goto LAB_0083ca31;
    }
  }
  __s = (int *)0x0;
LAB_0083ca31:
  iVar6 = p->nRegs;
  if (0 < iVar6) {
    pVVar4 = p->vCos;
    iVar2 = p->nTruePos;
    iVar8 = 0;
    do {
      uVar9 = iVar2 + iVar8;
      if (((int)uVar9 < 0) || (pVVar4->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar5 = *(ulong *)((long)pVVar4->pArray[uVar9] + 8);
      if (uVar5 == 0) {
LAB_0083ca8c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      iVar3 = *(int *)((uVar5 & 0xfffffffffffffffe) + 0x24);
      if (((long)iVar3 < 0) || (iVar1 <= iVar3)) goto LAB_0083ca8c;
      __s[iVar3] = __s[iVar3] + 1;
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar6);
  }
  return pVVar7;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// driver issue:arises when creating
// - driver ref-counter array
// - Ns2Glo maps
// - final partition
// - change-phase cube

// LI variable is used when
// - driver drives more than one LI
// - driver is a PI
// - driver is a constant

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of times each flop driver is referenced.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Llb_DriverCountRefs( Aig_Man_t * p )
{
    Vec_Int_t * vCounts;
    Aig_Obj_t * pObj;
    int i;
    vCounts = Vec_IntStart( Aig_ManObjNumMax(p) );
    Saig_ManForEachLi( p, pObj, i )
        Vec_IntAddToEntry( vCounts, Aig_ObjFaninId0(pObj), 1 );
    return vCounts;
}